

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O1

void __thiscall
Pass1::error<Format<std::__cxx11::string,std::__cxx11::string>>
          (Pass1 *this,Expression *expression,
          Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *t)

{
  Function *pFVar1;
  char *path;
  Printer local_8;
  
  local_8.ostream = (ostream *)&std::cerr;
  pFVar1 = this->key->old_function;
  path = (char *)(pFVar1->path)._M_string_length;
  if (path != (char *)0x0) {
    path = (pFVar1->path)._M_dataplus._M_p;
  }
  print_error<Format<std::__cxx11::string,std::__cxx11::string>>
            (&local_8,path,expression->position,t);
  exit(1);
}

Assistant:

[[noreturn]] void error(const Expression& expression, const T& t) {
		print_error(Printer(std::cerr), key.old_function->get_path(), expression.get_position(), t);
		std::exit(EXIT_FAILURE);
	}